

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O0

string * __thiscall OpenMD::AtomType::getName_abi_cxx11_(AtomType *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x18));
  return in_RDI;
}

Assistant:

string AtomType::getName() { return name_; }